

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void Json::CharReaderBuilder::strictMode(Value *settings)

{
  bool bVar1;
  ushort uVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  ValueHolder VVar6;
  undefined4 uVar7;
  ValueHolder *pVVar8;
  ValueHolder local_188;
  ushort local_180;
  ValueHolder local_178;
  ValueHolder local_170;
  ValueHolder local_168;
  ValueHolder local_160;
  ushort local_158;
  ValueHolder local_150;
  ValueHolder local_148;
  ValueHolder local_140;
  ValueHolder local_138;
  ushort local_130;
  ValueHolder local_128;
  ValueHolder local_120;
  ValueHolder local_118;
  ValueHolder local_110;
  ushort local_108;
  ValueHolder local_100;
  ValueHolder local_f8;
  ValueHolder local_f0;
  ValueHolder local_e8;
  ushort local_e0;
  ValueHolder local_d8;
  ValueHolder local_d0;
  ValueHolder local_c8;
  ValueHolder local_c0;
  ushort local_b8;
  ValueHolder local_b0;
  ValueHolder local_a8;
  ValueHolder local_a0;
  ValueHolder local_98;
  ushort local_90;
  ValueHolder local_88;
  ValueHolder local_80;
  ValueHolder local_78;
  ValueHolder local_70;
  ushort local_68;
  ValueHolder local_60;
  ValueHolder local_58;
  ValueHolder local_50;
  ValueHolder local_48;
  ushort local_40;
  ValueHolder local_38;
  ValueHolder local_30;
  ValueHolder local_28;
  
  Value::Value((Value *)&local_48,false);
  pVVar8 = &Value::resolveReference(settings,"allowComments","")->value_;
  uVar7 = _local_40;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_40._0_1_;
  _local_40 = CONCAT31(stack0xffffffffffffffc1,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_48;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_40 & 0x100;
  _local_40 = CONCAT22(SUB42(uVar7,2),local_40 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_38;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_30;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_28;
  local_48 = VVar3;
  local_38 = VVar4;
  local_30 = VVar5;
  local_28 = VVar6;
  Value::~Value((Value *)&local_48);
  Value::Value((Value *)&local_70,true);
  pVVar8 = &Value::resolveReference(settings,"strictRoot","")->value_;
  uVar7 = _local_68;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_68._0_1_;
  _local_68 = CONCAT31(stack0xffffffffffffff99,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_70;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_68 & 0x100;
  _local_68 = CONCAT22(SUB42(uVar7,2),local_68 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_60;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_58;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_50;
  local_70 = VVar3;
  local_60 = VVar4;
  local_58 = VVar5;
  local_50 = VVar6;
  Value::~Value((Value *)&local_70);
  Value::Value((Value *)&local_98,false);
  pVVar8 = &Value::resolveReference(settings,"allowDroppedNullPlaceholders","")->value_;
  uVar7 = _local_90;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_90._0_1_;
  _local_90 = CONCAT31(stack0xffffffffffffff71,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_98;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_90 & 0x100;
  _local_90 = CONCAT22(SUB42(uVar7,2),local_90 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_88;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_80;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_78;
  local_98 = VVar3;
  local_88 = VVar4;
  local_80 = VVar5;
  local_78 = VVar6;
  Value::~Value((Value *)&local_98);
  Value::Value((Value *)&local_c0,false);
  pVVar8 = &Value::resolveReference(settings,"allowNumericKeys","")->value_;
  uVar7 = _local_b8;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_b8._0_1_;
  _local_b8 = CONCAT31(stack0xffffffffffffff49,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_c0;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_b8 & 0x100;
  _local_b8 = CONCAT22(SUB42(uVar7,2),local_b8 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_b0;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_a8;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_a0;
  local_c0 = VVar3;
  local_b0 = VVar4;
  local_a8 = VVar5;
  local_a0 = VVar6;
  Value::~Value((Value *)&local_c0);
  Value::Value((Value *)&local_e8,false);
  pVVar8 = &Value::resolveReference(settings,"allowSingleQuotes","")->value_;
  uVar7 = _local_e0;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_e0._0_1_;
  _local_e0 = CONCAT31(stack0xffffffffffffff21,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_e8;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_e0 & 0x100;
  _local_e0 = CONCAT22(SUB42(uVar7,2),local_e0 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_d8;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_d0;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_c8;
  local_e8 = VVar3;
  local_d8 = VVar4;
  local_d0 = VVar5;
  local_c8 = VVar6;
  Value::~Value((Value *)&local_e8);
  Value::Value((Value *)&local_110,1000);
  pVVar8 = &Value::resolveReference(settings,"stackLimit","")->value_;
  uVar7 = _local_108;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_108._0_1_;
  _local_108 = CONCAT31(stack0xfffffffffffffef9,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_110;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_108 & 0x100;
  _local_108 = CONCAT22(SUB42(uVar7,2),local_108 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_100;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_f8;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_f0;
  local_110 = VVar3;
  local_100 = VVar4;
  local_f8 = VVar5;
  local_f0 = VVar6;
  Value::~Value((Value *)&local_110);
  Value::Value((Value *)&local_138,true);
  pVVar8 = &Value::resolveReference(settings,"failIfExtra","")->value_;
  uVar7 = _local_130;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_130._0_1_;
  _local_130 = CONCAT31(stack0xfffffffffffffed1,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_138;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_130 & 0x100;
  _local_130 = CONCAT22(SUB42(uVar7,2),local_130 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_128;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_120;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_118;
  local_138 = VVar3;
  local_128 = VVar4;
  local_120 = VVar5;
  local_118 = VVar6;
  Value::~Value((Value *)&local_138);
  Value::Value((Value *)&local_160,true);
  pVVar8 = &Value::resolveReference(settings,"rejectDupKeys","")->value_;
  uVar7 = _local_158;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_158._0_1_;
  _local_158 = CONCAT31(stack0xfffffffffffffea9,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_160;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_158 & 0x100;
  _local_158 = CONCAT22(SUB42(uVar7,2),local_158 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_150;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_148;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_140;
  local_160 = VVar3;
  local_150 = VVar4;
  local_148 = VVar5;
  local_140 = VVar6;
  Value::~Value((Value *)&local_160);
  Value::Value((Value *)&local_188,false);
  pVVar8 = &Value::resolveReference(settings,"allowSpecialFloats","")->value_;
  uVar7 = _local_180;
  bVar1 = pVVar8[1].bool_;
  pVVar8[1].bool_ = local_180._0_1_;
  _local_180 = CONCAT31(stack0xfffffffffffffe81,bVar1);
  VVar3 = *pVVar8;
  *pVVar8 = local_188;
  uVar2 = *(ushort *)(pVVar8 + 1);
  *(ushort *)(pVVar8 + 1) = uVar2 & 0xfeff | local_180 & 0x100;
  _local_180 = CONCAT22(SUB42(uVar7,2),local_180 & 0xfeff | uVar2 & 0x100);
  VVar4 = pVVar8[2];
  pVVar8[2] = local_178;
  VVar5 = pVVar8[3];
  pVVar8[3] = local_170;
  VVar6 = pVVar8[4];
  pVVar8[4] = local_168;
  local_188 = VVar3;
  local_178 = VVar4;
  local_170 = VVar5;
  local_168 = VVar6;
  Value::~Value((Value *)&local_188);
  return;
}

Assistant:

void CharReaderBuilder::strictMode(Json::Value* settings)
{
//! [CharReaderBuilderStrictMode]
  (*settings)["allowComments"] = false;
  (*settings)["strictRoot"] = true;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = true;
  (*settings)["rejectDupKeys"] = true;
  (*settings)["allowSpecialFloats"] = false;
//! [CharReaderBuilderStrictMode]
}